

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O0

string_t duckdb::NumericHelper::FormatSigned<unsigned_int>(uint value,Vector *vector)

{
  char cVar1;
  int iVar2;
  string_t *this;
  char *pcVar3;
  int in_EDI;
  anon_union_16_2_67f50693_for_value aVar4;
  char *endptr;
  char *dataptr;
  unsigned_long length;
  unsigned_t unsigned_value;
  int8_t sign;
  string_t result;
  Vector *in_stack_ffffffffffffffc0;
  
  cVar1 = AbsValue<signed_char>('\0');
  iVar2 = UnsignedLength<unsigned_int>(in_EDI + cVar1);
  cVar1 = AbsValue<signed_char>('\0');
  this = (string_t *)UnsafeNumericCast<unsigned_long,int,void>(iVar2 + cVar1);
  aVar4.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString(in_stack_ffffffffffffffc0,CONCAT44(iVar2,in_EDI));
  pcVar3 = string_t::GetDataWriteable((string_t *)in_stack_ffffffffffffffc0);
  FormatUnsigned<unsigned_int>((uint)((ulong)pcVar3 >> 0x20),pcVar3 + (long)this);
  string_t::Finalize(this);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar4.pointer;
}

Assistant:

static string_t FormatSigned(T value, Vector &vector) {
		typedef typename MakeUnsigned<T>::type unsigned_t;
		int8_t sign = -(value < 0);
		unsigned_t unsigned_value = unsigned_t(value ^ T(sign)) + unsigned_t(AbsValue(sign));
		auto length = UnsafeNumericCast<idx_t>(UnsignedLength<unsigned_t>(unsigned_value) + AbsValue(sign));
		string_t result = StringVector::EmptyString(vector, length);
		auto dataptr = result.GetDataWriteable();
		auto endptr = dataptr + length;
		endptr = FormatUnsigned(unsigned_value, endptr);
		if (sign) {
			*--endptr = '-';
		}
		result.Finalize();
		return result;
	}